

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O3

vector<wasm::SIMDReplaceOp,_std::allocator<wasm::SIMDReplaceOp>_> * __thiscall
wasm::Random::items<wasm::SIMDReplaceOp>
          (vector<wasm::SIMDReplaceOp,_std::allocator<wasm::SIMDReplaceOp>_> *__return_storage_ptr__
          ,Random *this,FeatureOptions<wasm::SIMDReplaceOp> *picker)

{
  _Rb_tree_node_base *p_Var1;
  
  (__return_storage_ptr__->
  super__Vector_base<wasm::SIMDReplaceOp,_std::allocator<wasm::SIMDReplaceOp>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<wasm::SIMDReplaceOp,_std::allocator<wasm::SIMDReplaceOp>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<wasm::SIMDReplaceOp,_std::allocator<wasm::SIMDReplaceOp>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (p_Var1 = (picker->options)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(picker->options)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    if ((p_Var1[1]._M_color & ~(this->features).features) == _S_red) {
      std::vector<wasm::SIMDReplaceOp,_std::allocator<wasm::SIMDReplaceOp>_>::reserve
                (__return_storage_ptr__,
                 ((long)p_Var1[1]._M_left - (long)p_Var1[1]._M_parent >> 2) +
                 ((long)(__return_storage_ptr__->
                        super__Vector_base<wasm::SIMDReplaceOp,_std::allocator<wasm::SIMDReplaceOp>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(__return_storage_ptr__->
                        super__Vector_base<wasm::SIMDReplaceOp,_std::allocator<wasm::SIMDReplaceOp>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 2));
      std::vector<wasm::SIMDReplaceOp,std::allocator<wasm::SIMDReplaceOp>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<wasm::SIMDReplaceOp_const*,std::vector<wasm::SIMDReplaceOp,std::allocator<wasm::SIMDReplaceOp>>>>
                ((vector<wasm::SIMDReplaceOp,std::allocator<wasm::SIMDReplaceOp>> *)
                 __return_storage_ptr__,
                 (__return_storage_ptr__->
                 super__Vector_base<wasm::SIMDReplaceOp,_std::allocator<wasm::SIMDReplaceOp>_>).
                 _M_impl.super__Vector_impl_data._M_finish,p_Var1[1]._M_parent,p_Var1[1]._M_left);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> items(FeatureOptions<T>& picker) {
    std::vector<T> matches;
    for (const auto& item : picker.options) {
      if (features.has(item.first)) {
        matches.reserve(matches.size() + item.second.size());
        matches.insert(matches.end(), item.second.begin(), item.second.end());
      }
    }
    return matches;
  }